

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall pfederc::BaseLogger::error(BaseLogger *this,string *msg)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->err,(string *)msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void BaseLogger::error(const std::string &msg) noexcept {
  err << msg << std::endl;
}